

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O3

bool __thiscall
MapLoader::validateCountryLine
          (MapLoader *this,int *countryCount,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lineWords,int *lineCount,bool *validMap,int *countryID,int *continentCount,bool verbose)

{
  uint uVar1;
  ostream *poVar2;
  pointer pbVar3;
  uint *puVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  char *local_38;
  
  *countryCount = *countryCount + 1;
  pbVar3 = (lineWords->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(lineWords->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3;
  if (uVar7 < 0x41) {
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Line ",5);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*lineCount);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,
                 " - [ERROR] : a line in the countries declaration had missing tokens, map could not be created.\n"
                 ,0x5f);
    }
    *validMap = false;
    return false;
  }
  if (verbose && uVar7 != 0x60) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Line ",5);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*lineCount);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," - [WARNING] : a line in  the countries declaration had extra tokens.\n",0x46
              );
    pbVar3 = (lineWords->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  pcVar9 = (pbVar3->_M_dataplus)._M_p;
  puVar4 = (uint *)__errno_location();
  uVar1 = *puVar4;
  *puVar4 = 0;
  lVar5 = strtol(pcVar9,&local_38,10);
  if (local_38 == pcVar9) {
    std::__throw_invalid_argument("stoi");
LAB_001180ea:
    uVar8 = (uint)pcVar9;
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((int)lVar5 != lVar5) goto LAB_001180ea;
    uVar8 = *puVar4;
    pcVar9 = (char *)(ulong)uVar8;
    if (uVar8 == 0x22) goto LAB_001180ea;
    if (uVar8 == 0) {
      *puVar4 = uVar1;
      uVar8 = uVar1;
    }
    if (*countryID != (int)lVar5) {
LAB_0011807a:
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Line ",5);
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*lineCount);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2," - [ERROR] : a country or continent ID did was invalid.\n",0x38);
      }
      *validMap = false;
      return false;
    }
    pcVar9 = (lineWords->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
    *puVar4 = 0;
    lVar5 = strtol(pcVar9,&local_38,10);
    if (local_38 != pcVar9) {
      if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*puVar4 != 0x22)) {
        if (*puVar4 == 0) {
          *puVar4 = uVar8;
        }
        if ((int)lVar5 <= *continentCount) {
          *countryID = *countryID + 1;
          return true;
        }
        goto LAB_0011807a;
      }
      goto LAB_00118102;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00118102:
  uVar6 = std::__throw_out_of_range("stoi");
  if (*puVar4 == 0) {
    *puVar4 = uVar8;
  }
  _Unwind_Resume(uVar6);
}

Assistant:

bool MapLoader::validateCountryLine(int* countryCount, std::vector<std::string>* lineWords, const int* lineCount,
                               bool* validMap,
                               int* countryID, const int* continentCount,bool verbose) {
    (*countryCount)++;
    //check validity of the line in this mode
    if (lineWords->size() < 3) {
        if(verbose){
            std::cout << "Line " << *lineCount
                      << " - [ERROR] : a line in the countries declaration had missing tokens, map could not be created.\n";
        }
        *validMap = false;
        return false;
    } else {
        if (lineWords->size() > 3 && verbose)
            std::cout << "Line " << *lineCount
                      << " - [WARNING] : a line in  the countries declaration had extra tokens.\n";
        //check country id matches with order and that it references a valid continent
        if (std::stoi((*lineWords)[0]) == *countryID && std::stoi((*lineWords)[2]) <= *continentCount) {
            (*countryID)++;
            return true;
        } else {
            if(verbose){
                std::cout << "Line " << *lineCount << " - [ERROR] : a country or continent ID did was invalid.\n";
            }
            *validMap = false;
            return false;
        }
    }
}